

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

int get_password_response(uint32_t nonce,char *password,uint8_t *response)

{
  uint8_t uVar1;
  size_t sVar2;
  uint8_t *data;
  long lVar3;
  uint8_t uVar4;
  uint len;
  
  sVar2 = strlen(password);
  len = (int)sVar2 + 8;
  data = (uint8_t *)malloc((ulong)len);
  for (lVar3 = 0; uVar1 = password[lVar3], uVar1 != '\0'; lVar3 = lVar3 + 1) {
    uVar4 = uVar1 + 0xe0;
    if (0x19 < (byte)(uVar1 + 0x9f)) {
      uVar4 = uVar1;
    }
    data[lVar3] = uVar4;
  }
  digest_to_hex32(nonce,(char *)(data + lVar3));
  digest_get(data,len,response);
  free(data);
  return 0;
}

Assistant:

int get_password_response(uint32_t nonce, const char *password,
			  uint8_t response[PROXY_PASS_RES_LEN])
{
	unsigned int pass_with_nonce_len = (unsigned int)strlen(password) + 8;
	uint8_t *pass_with_nonce = malloc(pass_with_nonce_len);
	char *iter = (char *)pass_with_nonce;

	while (*password != '\0') {
		if (*password >= 97 && *password <= 122)
			*iter = *password - 32;
		else
			*iter = *password;

		iter++;
		password++;
	}

	digest_to_hex32(nonce, iter);

	digest_get(pass_with_nonce, pass_with_nonce_len, response);

	free(pass_with_nonce);

	return 0;
}